

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::NestedDescriptorTest_MessageName_Test::
~NestedDescriptorTest_MessageName_Test(NestedDescriptorTest_MessageName_Test *this)

{
  (this->super_NestedDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NestedDescriptorTest_01883358;
  DescriptorPool::~DescriptorPool(&(this->super_NestedDescriptorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x108);
  return;
}

Assistant:

TEST_F(NestedDescriptorTest, MessageName) {
  EXPECT_EQ("Foo", foo_->name());
  EXPECT_EQ("Bar", bar_->name());
  EXPECT_EQ("Foo", foo2_->name());
  EXPECT_EQ("Baz", baz2_->name());

  EXPECT_EQ("TestMessage.Foo", foo_->full_name());
  EXPECT_EQ("TestMessage.Bar", bar_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Foo", foo2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Baz", baz2_->full_name());
}